

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O0

QString * double2string(double num,int base,int ndigits,bool *oflow)

{
  QChar *pQVar1;
  qsizetype qVar2;
  bool *in_RCX;
  uint in_EDX;
  int in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  qsizetype i;
  int nd;
  bool of;
  QString *s;
  undefined4 in_stack_ffffffffffffff58;
  CaseSensitivity in_stack_ffffffffffffff5c;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  QString *in_stack_ffffffffffffff68;
  bool local_8a;
  qsizetype in_stack_ffffffffffffff88;
  QChar ch;
  uint local_6c;
  QChar local_40;
  QChar local_3e;
  QChar local_3c;
  QChar local_3a;
  char local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x5ba4f7);
  local_6c = in_EDX;
  if (in_ESI == 1) {
    do {
      ch.ucs = (char16_t)((ulong)in_stack_ffffffffffffff88 >> 0x30);
      QString::asprintf(local_38,in_XMM0_Qa,"%*.*g",(ulong)in_EDX,(ulong)local_6c);
      QString::operator=((QString *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                         (QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      QString::~QString((QString *)0x5ba5ea);
      QChar::QChar<char16_t,_true>(&local_3a,L'e');
      in_stack_ffffffffffffff88 =
           QString::indexOf(in_stack_ffffffffffffff68,ch,
                            CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                            in_stack_ffffffffffffff5c);
      local_8a = false;
      if (0 < in_stack_ffffffffffffff88) {
        in_stack_ffffffffffffff68 =
             (QString *)
             QString::operator[]((QString *)
                                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                 0x5ba637);
        QChar::QChar<char16_t,_true>(&local_3c,L'+');
        local_8a = operator==((QChar *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60)
                              ,(QChar *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58
                                                ));
      }
      if (local_8a != false) {
        QChar::QChar<char16_t,_true>(&local_3e,L' ');
        pQVar1 = QString::operator[]((QString *)
                                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                     0x5ba686);
        pQVar1->ucs = local_3e.ucs;
        QChar::QChar<char16_t,_true>(&local_40,L'e');
        pQVar1 = QString::operator[]((QString *)
                                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                     0x5ba6b0);
        pQVar1->ucs = local_40.ucs;
      }
      in_stack_ffffffffffffff67 = false;
      if (local_6c != 0) {
        qVar2 = QString::size(in_RDI);
        in_stack_ffffffffffffff67 = (int)in_EDX < (int)qVar2;
      }
      local_6c = local_6c - 1;
    } while ((bool)in_stack_ffffffffffffff67 != false);
  }
  else {
    if (2147483648.0 <= in_XMM0_Qa || in_XMM0_Qa < -2147483648.0) {
      if (in_RCX != (bool *)0x0) {
        *in_RCX = true;
      }
      goto LAB_005ba725;
    }
    int2string((int)((ulong)in_XMM0_Qa >> 0x20),SUB84(in_XMM0_Qa,0),in_ESI,in_RCX);
    QString::operator=((QString *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                       (QString *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    QString::~QString((QString *)0x5ba5a3);
  }
  if (in_RCX != (bool *)0x0) {
    qVar2 = QString::size(in_RDI);
    *in_RCX = (int)in_EDX < (int)qVar2;
  }
LAB_005ba725:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static QString double2string(double num, int base, int ndigits, bool *oflow)
{
    QString s;
    if (base != QLCDNumber::Dec) {
        bool of = num >= 2147483648.0 || num < -2147483648.0;
        if (of) {                             // oops, integer overflow
            if (oflow)
                *oflow = true;
            return s;
        }
        s = int2string((int)num, base, ndigits, nullptr);
    } else {                                    // decimal base
        int nd = ndigits;
        do {
            s = QString::asprintf("%*.*g", ndigits, nd, num);
            qsizetype i = s.indexOf(u'e');
            if (i > 0 && s[i+1]==u'+') {
                s[i] = u' ';
                s[i+1] = u'e';
            }
        } while (nd-- && (int)s.size() > ndigits);
    }
    if (oflow)
        *oflow = (int)s.size() > ndigits;
    return s;
}